

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O3

void __thiscall
icu_63::CollationBuilder::addRelation
          (CollationBuilder *this,int32_t strength,UnicodeString *prefix,UnicodeString *str,
          UnicodeString *extension,char **parserErrorReason,UErrorCode *errorCode)

{
  ulong uVar1;
  UBool UVar2;
  int32_t iVar3;
  uint uVar4;
  int32_t iVar5;
  int iVar6;
  uint32_t ce32;
  char *pcVar7;
  uint uVar8;
  uint uVar9;
  UnicodeString nfdString;
  UnicodeString nfdPrefix;
  UnicodeString nfdExtension;
  bool local_109;
  UnicodeString local_f0;
  UnicodeString local_b0;
  UnicodeString local_70;
  
  if (U_ZERO_ERROR < *errorCode) {
    return;
  }
  local_b0.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003e5ab8;
  local_b0.fUnion.fStackFields.fLengthAndFlags = 2;
  if ((0x1f < (ushort)(prefix->fUnion).fStackFields.fLengthAndFlags) &&
     ((*(this->nfd->super_UObject)._vptr_UObject[3])(this->nfd,prefix,&local_b0,errorCode),
     U_ZERO_ERROR < *errorCode)) {
    *parserErrorReason = "normalizing the relation prefix";
    goto LAB_0022e638;
  }
  local_f0.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003e5ab8;
  local_f0.fUnion.fStackFields.fLengthAndFlags = 2;
  (*(this->nfd->super_UObject)._vptr_UObject[3])(this->nfd,str,&local_f0,errorCode);
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if (-1 < local_f0.fUnion.fStackFields.fLengthAndFlags) {
      local_f0.fUnion.fFields.fLength = (int)local_f0.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    if (1 < local_f0.fUnion.fFields.fLength) {
      if (((int)local_f0.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
        local_f0.fUnion.fFields.fArray = local_f0.fUnion.fStackFields.fBuffer;
      }
      if ((ushort)*local_f0.fUnion.fFields.fArray - 0x1113 < 0xffffffed &&
          (ushort)*local_f0.fUnion.fFields.fArray - 0x1176 < 0xffffffeb) {
        if (((ushort)*(char16_t *)
                      ((long)local_f0.fUnion.fFields.fArray +
                      ((ulong)(uint)local_f0.fUnion.fFields.fLength - 1) * 2) - 0x1113 < 0xffffffed)
           && (((ushort)*(char16_t *)
                         ((long)local_f0.fUnion.fFields.fArray +
                         ((ulong)(uint)local_f0.fUnion.fFields.fLength - 1) * 2) - 0x1176 <
                0xffffffeb ||
               ((ushort)*(char16_t *)
                         ((long)local_f0.fUnion.fFields.fArray +
                         ((ulong)(uint)local_f0.fUnion.fFields.fLength - 2) * 2) - 0x1113 <
                0xffffffed)))) goto LAB_0022e6d8;
        *errorCode = U_UNSUPPORTED_ERROR;
        pcVar7 = "contractions ending with conjoining Jamo L or L+V not supported";
      }
      else {
        *errorCode = U_UNSUPPORTED_ERROR;
        pcVar7 = "contractions starting with conjoining Jamo L or V not supported";
      }
      goto LAB_0022e626;
    }
LAB_0022e6d8:
    if (strength != 0xf) {
      iVar3 = findOrInsertNodeForCEs(this,strength,parserErrorReason,errorCode);
      uVar1 = this->ces[(long)this->cesLength + -1];
      if (strength == 0) {
        if (0xbfffffff < (int)uVar1 + 0xba000000U || uVar1 >> 0x20 != 0) goto LAB_0022e7fb;
        *errorCode = U_UNSUPPORTED_ERROR;
        pcVar7 = "tailoring primary after ignorables not supported";
      }
      else if ((strength == 3) && (uVar1 == 0)) {
        *errorCode = U_UNSUPPORTED_ERROR;
        pcVar7 = "tailoring quaternary after tertiary ignorables not supported";
      }
      else {
LAB_0022e7fb:
        local_109 = uVar1 == 0;
        uVar4 = insertTailoredNodeAfter(this,iVar3,strength,errorCode);
        if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
          if ((int)uVar1 + 0xba000000U < 0xc0000000) {
            uVar8 = 0;
            if (uVar1 >> 0x38 == 0) {
              uVar9 = 2;
              if (local_109) {
                uVar9 = 0xf;
              }
              uVar8 = 1;
              if ((char)(uVar1 >> 0x18) == '\0') {
                uVar8 = uVar9;
              }
            }
          }
          else {
            uVar8 = (uint)(uVar1 >> 8) & 3;
          }
          if ((int)uVar8 < strength) {
            strength = uVar8;
          }
          this->ces[(long)this->cesLength + -1] =
               ((ulong)((uVar4 & 0x3f) << 0x18) |
               (ulong)(uVar4 & 0x1fc0) << 0x2a | (ulong)(uVar4 & 0xfe000) << 0x2b) +
               0x4040000006002000 + (long)(strength << 8);
          goto LAB_0022e6dd;
        }
        pcVar7 = "modifying collation elements";
      }
      goto LAB_0022e626;
    }
LAB_0022e6dd:
    setCaseBits(this,&local_f0,parserErrorReason,errorCode);
    if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      iVar3 = this->cesLength;
      if ((ushort)(extension->fUnion).fStackFields.fLengthAndFlags < 0x20) {
LAB_0022e918:
        UVar2 = UnicodeString::operator!=(prefix,&local_b0);
        if (UVar2 == '\0') {
          UVar2 = UnicodeString::operator!=(str,&local_f0);
          ce32 = 0xffffffff;
          if (UVar2 != '\0') goto LAB_0022e948;
        }
        else {
LAB_0022e948:
          ce32 = 0xffffffff;
          if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
            iVar6 = (*(this->fcd->super_UObject)._vptr_UObject[0xb])(this->fcd,prefix,errorCode);
            ce32 = 0xffffffff;
            if (((char)iVar6 != '\0') && (UVar2 = ignoreString(this,str,errorCode), UVar2 == '\0'))
            {
              ce32 = addIfDifferent(this,prefix,str,this->ces,this->cesLength,0xffffffff,errorCode);
            }
          }
        }
        addWithClosure(this,&local_b0,&local_f0,this->ces,this->cesLength,ce32,errorCode);
        if (U_ZERO_ERROR < *errorCode) {
          pcVar7 = "writing collation elements";
          goto LAB_0022e626;
        }
        this->cesLength = iVar3;
      }
      else {
        local_70.super_Replaceable.super_UObject._vptr_UObject =
             (UObject)&PTR__UnicodeString_003e5ab8;
        local_70.fUnion.fStackFields.fLengthAndFlags = 2;
        (*(this->nfd->super_UObject)._vptr_UObject[3])(this->nfd,extension,&local_70,errorCode);
        if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
          iVar5 = CollationDataBuilder::getCEs
                            (this->dataBuilder,&local_70,this->ces,this->cesLength);
          this->cesLength = iVar5;
          if (iVar5 < 0x20) {
            UnicodeString::~UnicodeString(&local_70);
            goto LAB_0022e918;
          }
          *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
          pcVar7 = "extension string adds too many collation elements (more than 31 total)";
        }
        else {
          pcVar7 = "normalizing the relation extension";
        }
        *parserErrorReason = pcVar7;
        UnicodeString::~UnicodeString(&local_70);
      }
    }
  }
  else {
    pcVar7 = "normalizing the relation string";
LAB_0022e626:
    *parserErrorReason = pcVar7;
  }
  UnicodeString::~UnicodeString(&local_f0);
LAB_0022e638:
  UnicodeString::~UnicodeString(&local_b0);
  return;
}

Assistant:

void
CollationBuilder::addRelation(int32_t strength, const UnicodeString &prefix,
                              const UnicodeString &str, const UnicodeString &extension,
                              const char *&parserErrorReason, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return; }
    UnicodeString nfdPrefix;
    if(!prefix.isEmpty()) {
        nfd.normalize(prefix, nfdPrefix, errorCode);
        if(U_FAILURE(errorCode)) {
            parserErrorReason = "normalizing the relation prefix";
            return;
        }
    }
    UnicodeString nfdString = nfd.normalize(str, errorCode);
    if(U_FAILURE(errorCode)) {
        parserErrorReason = "normalizing the relation string";
        return;
    }

    // The runtime code decomposes Hangul syllables on the fly,
    // with recursive processing but without making the Jamo pieces visible for matching.
    // It does not work with certain types of contextual mappings.
    int32_t nfdLength = nfdString.length();
    if(nfdLength >= 2) {
        UChar c = nfdString.charAt(0);
        if(Hangul::isJamoL(c) || Hangul::isJamoV(c)) {
            // While handling a Hangul syllable, contractions starting with Jamo L or V
            // would not see the following Jamo of that syllable.
            errorCode = U_UNSUPPORTED_ERROR;
            parserErrorReason = "contractions starting with conjoining Jamo L or V not supported";
            return;
        }
        c = nfdString.charAt(nfdLength - 1);
        if(Hangul::isJamoL(c) ||
                (Hangul::isJamoV(c) && Hangul::isJamoL(nfdString.charAt(nfdLength - 2)))) {
            // A contraction ending with Jamo L or L+V would require
            // generating Hangul syllables in addTailComposites() (588 for a Jamo L),
            // or decomposing a following Hangul syllable on the fly, during contraction matching.
            errorCode = U_UNSUPPORTED_ERROR;
            parserErrorReason = "contractions ending with conjoining Jamo L or L+V not supported";
            return;
        }
        // A Hangul syllable completely inside a contraction is ok.
    }
    // Note: If there is a prefix, then the parser checked that
    // both the prefix and the string beging with NFC boundaries (not Jamo V or T).
    // Therefore: prefix.isEmpty() || !isJamoVOrT(nfdString.charAt(0))
    // (While handling a Hangul syllable, prefixes on Jamo V or T
    // would not see the previous Jamo of that syllable.)

    if(strength != UCOL_IDENTICAL) {
        // Find the node index after which we insert the new tailored node.
        int32_t index = findOrInsertNodeForCEs(strength, parserErrorReason, errorCode);
        U_ASSERT(cesLength > 0);
        int64_t ce = ces[cesLength - 1];
        if(strength == UCOL_PRIMARY && !isTempCE(ce) && (uint32_t)(ce >> 32) == 0) {
            // There is no primary gap between ignorables and the space-first-primary.
            errorCode = U_UNSUPPORTED_ERROR;
            parserErrorReason = "tailoring primary after ignorables not supported";
            return;
        }
        if(strength == UCOL_QUATERNARY && ce == 0) {
            // The CE data structure does not support non-zero quaternary weights
            // on tertiary ignorables.
            errorCode = U_UNSUPPORTED_ERROR;
            parserErrorReason = "tailoring quaternary after tertiary ignorables not supported";
            return;
        }
        // Insert the new tailored node.
        index = insertTailoredNodeAfter(index, strength, errorCode);
        if(U_FAILURE(errorCode)) {
            parserErrorReason = "modifying collation elements";
            return;
        }
        // Strength of the temporary CE:
        // The new relation may yield a stronger CE but not a weaker one.
        int32_t tempStrength = ceStrength(ce);
        if(strength < tempStrength) { tempStrength = strength; }
        ces[cesLength - 1] = tempCEFromIndexAndStrength(index, tempStrength);
    }

    setCaseBits(nfdString, parserErrorReason, errorCode);
    if(U_FAILURE(errorCode)) { return; }

    int32_t cesLengthBeforeExtension = cesLength;
    if(!extension.isEmpty()) {
        UnicodeString nfdExtension = nfd.normalize(extension, errorCode);
        if(U_FAILURE(errorCode)) {
            parserErrorReason = "normalizing the relation extension";
            return;
        }
        cesLength = dataBuilder->getCEs(nfdExtension, ces, cesLength);
        if(cesLength > Collation::MAX_EXPANSION_LENGTH) {
            errorCode = U_ILLEGAL_ARGUMENT_ERROR;
            parserErrorReason =
                "extension string adds too many collation elements (more than 31 total)";
            return;
        }
    }
    uint32_t ce32 = Collation::UNASSIGNED_CE32;
    if((prefix != nfdPrefix || str != nfdString) &&
            !ignorePrefix(prefix, errorCode) && !ignoreString(str, errorCode)) {
        // Map from the original input to the CEs.
        // We do this in case the canonical closure is incomplete,
        // so that it is possible to explicitly provide the missing mappings.
        ce32 = addIfDifferent(prefix, str, ces, cesLength, ce32, errorCode);
    }
    addWithClosure(nfdPrefix, nfdString, ces, cesLength, ce32, errorCode);
    if(U_FAILURE(errorCode)) {
        parserErrorReason = "writing collation elements";
        return;
    }
    cesLength = cesLengthBeforeExtension;
}